

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O2

void __thiscall Image_Select_Test::TestBody(Image_Select_Test *this)

{
  Point2i p;
  memory_resource *pmVar1;
  Allocator AVar2;
  long lVar3;
  int y;
  long lVar4;
  char *pcVar5;
  char *in_R9;
  Tuple2<pbrt::Point2,_int> expected_predicate_value;
  int x_1;
  int x;
  long lVar6;
  Float FVar7;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  Tuple2<pbrt::Point2,_int> local_488;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_7;
  ImageChannelDesc rgDesc;
  int local_424;
  long local_420;
  WrapMode2D local_418;
  WrapMode2D local_410;
  WrapMode2D local_408;
  WrapMode2D local_400;
  WrapMode2D local_3f8;
  WrapMode2D local_3f0;
  Image rgImage;
  ImageChannelDesc aDesc;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_2a0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> pix;
  Image aImage;
  Image image;
  
  GetFloatPixels(&pix,(Point2i)0x900000004,4);
  pmVar1 = pstd::pmr::new_delete_resource();
  rgImage.format = (PixelFormat)pmVar1;
  rgImage.resolution.super_Tuple2<pbrt::Point2,_int>.x = (int)((ulong)pmVar1 >> 0x20);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&local_2a0,&pix,(polymorphic_allocator<float> *)&rgImage);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&aImage,"A",(allocator<char> *)&aDesc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)aImage.channelNames.field_2.fixed,"B",(allocator<char> *)&rgDesc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(aImage.channelNames.field_2.fixed + 1),"G",(allocator<char> *)&gtest_ar__1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(aImage.channelNames.field_2.fixed + 2),"R",(allocator<char> *)&gtest_ar_7);
  channels.n = 4;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&aImage;
  pbrt::Image::Image(&image,&local_2a0,(Point2i)0x900000004,channels);
  lVar3 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&aImage.format + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&aImage,"A",(allocator<char> *)&rgImage);
  requestedChannels.n = 1;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&aImage;
  pbrt::Image::GetChannelDesc(&aDesc,&image,requestedChannels);
  std::__cxx11::string::~string((string *)&aImage);
  rgImage.resolution.super_Tuple2<pbrt::Point2,_int>.y = 0;
  rgImage._12_4_ = 0;
  rgImage.format = CONCAT31(rgImage.format._1_3_,aDesc.offset.nStored != 0);
  if (aDesc.offset.nStored == 0) {
    testing::Message::Message((Message *)&rgDesc);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&aImage,(internal *)&rgImage,(AssertionResult *)"bool(aDesc)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x250,(char *)CONCAT44(aImage.resolution.super_Tuple2<pbrt::Point2,_int>.x,
                                       aImage.format));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&rgDesc);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    std::__cxx11::string::~string((string *)&aImage);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&rgDesc);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&rgImage.resolution.super_Tuple2<pbrt::Point2,_int>.y);
  AVar2.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Image::SelectChannels(&aImage,&image,&aDesc,AVar2);
  rgDesc.offset.alloc.memoryResource._4_4_ = aImage.resolution.super_Tuple2<pbrt::Point2,_int>.y;
  gtest_ar__1._0_8_ = image.resolution.super_Tuple2<pbrt::Point2,_int>;
  expected_predicate_value = image.resolution.super_Tuple2<pbrt::Point2,_int>;
  testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
            ((internal *)&rgImage,"aImage.Resolution()","image.Resolution()",(Point2<int> *)&rgDesc,
             (Point2<int> *)&gtest_ar__1);
  if ((undefined1)rgImage.format == U256) {
    testing::Message::Message((Message *)&rgDesc);
    if ((undefined8 *)CONCAT44(rgImage._12_4_,rgImage.resolution.super_Tuple2<pbrt::Point2,_int>.y)
        == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT44(rgImage._12_4_,
                                  rgImage.resolution.super_Tuple2<pbrt::Point2,_int>.y);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x253,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&rgDesc);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&rgDesc);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&rgImage.resolution.super_Tuple2<pbrt::Point2,_int>.y);
  rgDesc.offset.alloc.memoryResource._0_4_ = 1.4013e-45;
  gtest_ar__1._0_4_ = (undefined4)aImage.channelNames.nStored;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&rgImage,"1","aImage.NChannels()",(int *)&rgDesc,(int *)&gtest_ar__1);
  if ((undefined1)rgImage.format == U256) {
    testing::Message::Message((Message *)&rgDesc);
    if ((undefined8 *)CONCAT44(rgImage._12_4_,rgImage.resolution.super_Tuple2<pbrt::Point2,_int>.y)
        == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT44(rgImage._12_4_,
                                  rgImage.resolution.super_Tuple2<pbrt::Point2,_int>.y);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x254,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&rgDesc);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&rgDesc);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&rgImage.resolution.super_Tuple2<pbrt::Point2,_int>.y);
  gtest_ar_7._0_4_ = 1;
  pbrt::Image::ChannelNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&rgImage,&aImage);
  gtest_ar__1._0_8_ =
       CONCAT44(rgImage._12_4_,rgImage.resolution.super_Tuple2<pbrt::Point2,_int>.y) -
       CONCAT44(rgImage.resolution.super_Tuple2<pbrt::Point2,_int>.x,rgImage.format) >> 5;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&rgDesc,"1","aImage.ChannelNames().size()",(int *)&gtest_ar_7,
             (unsigned_long *)&gtest_ar__1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&rgImage);
  if ((char)rgDesc.offset.alloc.memoryResource == '\0') {
    testing::Message::Message((Message *)&rgImage);
    if (rgDesc.offset.ptr == (int *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)rgDesc.offset.ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x255,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&rgImage);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&rgImage);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&rgDesc.offset.ptr);
  pbrt::Image::ChannelNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&rgImage,&aImage);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&rgDesc,"\"A\"","aImage.ChannelNames()[0]",(char (*) [2])0xa3f24e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(rgImage.resolution.super_Tuple2<pbrt::Point2,_int>.x,rgImage.format));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&rgImage);
  if ((char)rgDesc.offset.alloc.memoryResource == '\0') {
    testing::Message::Message((Message *)&rgImage);
    if (rgDesc.offset.ptr == (int *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)rgDesc.offset.ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x256,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&rgImage);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&rgImage);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&rgDesc.offset.ptr);
  lVar3 = 0;
  for (lVar4 = 0; lVar4 != 9; lVar4 = lVar4 + 1) {
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      pbrt::WrapMode2D::WrapMode2D(&local_3f0,Clamp);
      FVar7 = pbrt::Image::GetChannel(&aImage,(Point2i)(lVar3 + lVar6),0,local_3f0);
      rgDesc.offset.alloc.memoryResource._0_4_ = FVar7;
      pbrt::WrapMode2D::WrapMode2D(&local_3f8,Clamp);
      FVar7 = pbrt::Image::GetChannel(&image,(Point2i)(lVar3 + lVar6),0,local_3f8);
      gtest_ar__1._0_4_ = FVar7;
      testing::internal::CmpHelperEQ<float,float>
                ((internal *)&rgImage,"aImage.GetChannel({x, y}, 0)","image.GetChannel({x, y}, 0)",
                 (float *)&rgDesc,(float *)&gtest_ar__1);
      if ((undefined1)rgImage.format == U256) {
        testing::Message::Message((Message *)&rgDesc);
        pcVar5 = "";
        if ((undefined8 *)
            CONCAT44(rgImage._12_4_,rgImage.resolution.super_Tuple2<pbrt::Point2,_int>.y) !=
            (undefined8 *)0x0) {
          pcVar5 = *(char **)CONCAT44(rgImage._12_4_,
                                      rgImage.resolution.super_Tuple2<pbrt::Point2,_int>.y);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                   ,0x259,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&rgDesc);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&rgDesc);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&rgImage.resolution.super_Tuple2<pbrt::Point2,_int>.y);
    }
    lVar3 = lVar3 + 0x100000000;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rgImage,"R",(allocator<char> *)&gtest_ar__1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)rgImage.channelNames.field_2.fixed,"G",(allocator<char> *)&gtest_ar_7);
  requestedChannels_00.n = 2;
  requestedChannels_00.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rgImage;
  pbrt::Image::GetChannelDesc(&rgDesc,&image,requestedChannels_00);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&rgImage.format + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar__1.success_ = rgDesc.offset.nStored != 0;
  if (rgDesc.offset.nStored == 0) {
    testing::Message::Message((Message *)&gtest_ar_7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&rgImage,(internal *)&gtest_ar__1,(AssertionResult *)"bool(rgDesc)","false"
               ,"true",(char *)expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x25c,(char *)CONCAT44(rgImage.resolution.super_Tuple2<pbrt::Point2,_int>.x,
                                       rgImage.format));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_488,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_488);
    std::__cxx11::string::~string((string *)&rgImage);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  AVar2.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Image::SelectChannels(&rgImage,&image,&rgDesc,AVar2);
  gtest_ar_7._4_4_ = rgImage.resolution.super_Tuple2<pbrt::Point2,_int>.y;
  gtest_ar_7._0_4_ = rgImage.resolution.super_Tuple2<pbrt::Point2,_int>.x;
  local_488 = image.resolution.super_Tuple2<pbrt::Point2,_int>;
  testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
            ((internal *)&gtest_ar__1,"rgImage.Resolution()","image.Resolution()",
             (Point2<int> *)&gtest_ar_7,(Point2<int> *)&local_488);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_7);
    if (gtest_ar__1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x25e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_488,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_488);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  gtest_ar_7._0_4_ = 2;
  local_488.x = (int)rgImage.channelNames.nStored;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__1,"2","rgImage.NChannels()",(int *)&gtest_ar_7,&local_488.x);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_7);
    if (gtest_ar__1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x25f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_488,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_488);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  local_424 = 2;
  pbrt::Image::ChannelNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&gtest_ar__1,&rgImage);
  local_488 = (Tuple2<pbrt::Point2,_int>)((long)gtest_ar__1.message_.ptr_ - gtest_ar__1._0_8_ >> 5);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_7,"2","rgImage.ChannelNames().size()",&local_424,
             (unsigned_long *)&local_488);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar__1);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_7.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x260,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_488,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_488);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_7.message_);
  pbrt::Image::ChannelNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&gtest_ar__1,&rgImage);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&gtest_ar_7,"\"R\"","rgImage.ChannelNames()[0]",(char (*) [2])0x59038c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar__1._0_8_)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar__1);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_7.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x261,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_488,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_488);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_7.message_);
  pbrt::Image::ChannelNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&gtest_ar__1,&rgImage);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&gtest_ar_7,"\"G\"","rgImage.ChannelNames()[1]",(char (*) [2])0x59039f,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (gtest_ar__1._0_8_ + 0x20));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar__1);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_7.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x262,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_488,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_488);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_7.message_);
  local_420 = 0;
  for (lVar3 = 0; lVar3 != 9; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      pbrt::WrapMode2D::WrapMode2D(&local_400,Clamp);
      p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_420 + lVar4);
      FVar7 = pbrt::Image::GetChannel(&rgImage,p,0,local_400);
      gtest_ar_7._0_4_ = FVar7;
      pbrt::WrapMode2D::WrapMode2D(&local_408,Clamp);
      FVar7 = pbrt::Image::GetChannel(&image,p,3,local_408);
      local_488.x = (int)FVar7;
      testing::internal::CmpHelperEQ<float,float>
                ((internal *)&gtest_ar__1,"rgImage.GetChannel({x, y}, 0)",
                 "image.GetChannel({x, y}, 3)",(float *)&gtest_ar_7,(float *)&local_488);
      if (gtest_ar__1.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_7);
        pcVar5 = "";
        if (gtest_ar__1.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_488,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                   ,0x265,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_488,(Message *)&gtest_ar_7);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_488);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_7);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar__1.message_);
      pbrt::WrapMode2D::WrapMode2D(&local_410,Clamp);
      FVar7 = pbrt::Image::GetChannel(&rgImage,p,1,local_410);
      gtest_ar_7._0_4_ = FVar7;
      pbrt::WrapMode2D::WrapMode2D(&local_418,Clamp);
      FVar7 = pbrt::Image::GetChannel(&image,p,2,local_418);
      local_488.x = (int)FVar7;
      testing::internal::CmpHelperEQ<float,float>
                ((internal *)&gtest_ar__1,"rgImage.GetChannel({x, y}, 1)",
                 "image.GetChannel({x, y}, 2)",(float *)&gtest_ar_7,(float *)&local_488);
      if (gtest_ar__1.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_7);
        pcVar5 = "";
        if (gtest_ar__1.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_488,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                   ,0x266,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_488,(Message *)&gtest_ar_7);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_488);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_7);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar__1.message_);
    }
    local_420 = local_420 + 0x100000000;
  }
  pbrt::Image::~Image(&rgImage);
  pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
            (&rgDesc.offset);
  pbrt::Image::~Image(&aImage);
  pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&aDesc.offset)
  ;
  pbrt::Image::~Image(&image);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&pix);
  return;
}

Assistant:

TEST(Image, Select) {
    Point2i res(4, 9);
    pstd::vector<float> pix = GetFloatPixels(res, 4);
    Image image(pix, res, {"A", "B", "G", "R"});

    auto aDesc = image.GetChannelDesc({"A"});
    EXPECT_TRUE(bool(aDesc));
    Image aImage = image.SelectChannels(aDesc);

    EXPECT_EQ(aImage.Resolution(), image.Resolution());
    EXPECT_EQ(1, aImage.NChannels());
    EXPECT_EQ(1, aImage.ChannelNames().size());
    EXPECT_EQ("A", aImage.ChannelNames()[0]);
    for (int y = 0; y < res.y; ++y)
        for (int x = 0; x < res.x; ++x)
            EXPECT_EQ(aImage.GetChannel({x, y}, 0), image.GetChannel({x, y}, 0));

    auto rgDesc = image.GetChannelDesc({"R", "G"});
    EXPECT_TRUE(bool(rgDesc));
    Image rgImage = image.SelectChannels(rgDesc);
    EXPECT_EQ(rgImage.Resolution(), image.Resolution());
    EXPECT_EQ(2, rgImage.NChannels());
    EXPECT_EQ(2, rgImage.ChannelNames().size());
    EXPECT_EQ("R", rgImage.ChannelNames()[0]);
    EXPECT_EQ("G", rgImage.ChannelNames()[1]);
    for (int y = 0; y < res.y; ++y)
        for (int x = 0; x < res.x; ++x) {
            EXPECT_EQ(rgImage.GetChannel({x, y}, 0), image.GetChannel({x, y}, 3));
            EXPECT_EQ(rgImage.GetChannel({x, y}, 1), image.GetChannel({x, y}, 2));
        }
}